

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::
       tuple_caster<std::tuple,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
       ::
       cast_impl<std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>const&,0ul,1ul,2ul,3ul,4ul>
                 (itype *src,return_value_policy policy,handle parent)

{
  undefined8 uVar1;
  long lVar2;
  handle hVar3;
  object local_58;
  array<pybind11::object,_5UL> entries;
  tuple result;
  
  local_58.super_handle.m_ptr = (handle)PyLong_FromSize_t(src[4]);
  entries._M_elems[0].super_handle.m_ptr = (handle)PyLong_FromSize_t(src[3]);
  if ((char)src[2] == Data) {
    entries._M_elems[1].super_handle.m_ptr = (handle)&_Py_FalseStruct;
  }
  else {
    entries._M_elems[1].super_handle.m_ptr = (handle)&_Py_TrueStruct;
  }
  ((PyObject *)entries._M_elems[1].super_handle.m_ptr)->ob_refcnt =
       ((PyObject *)entries._M_elems[1].super_handle.m_ptr)->ob_refcnt + 1;
  entries._M_elems[2].super_handle =
       type_caster_base<kratos::PortDirection>::cast(src + 1,policy,parent);
  entries._M_elems[3].super_handle = type_caster_base<kratos::PortType>::cast(src,policy,parent);
  hVar3.m_ptr = (PyObject *)0x0;
  lVar2 = 0;
  do {
    if (*(long *)((long)(entries._M_elems + -1) + lVar2) == 0) goto LAB_002be47b;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x28);
  tuple::tuple<unsigned_long,_0>((tuple *)(entries._M_elems + 4),5);
  hVar3 = entries._M_elems[4].super_handle.m_ptr;
  lVar2 = 0;
  do {
    uVar1 = *(undefined8 *)((long)(entries._M_elems + -1) + lVar2);
    *(undefined8 *)((long)(entries._M_elems + -1) + lVar2) = 0;
    if ((*(byte *)(*(long *)((long)entries._M_elems[4].super_handle.m_ptr + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                    ,0x280,
                    "static handle pybind11::detail::tuple_caster<std::tuple, unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType>, T = const std::tuple<unsigned int, unsigned int, bool, kratos::PortDirection, kratos::PortType> &, Is = <0UL, 1UL, 2UL, 3UL, 4UL>]"
                   );
    }
    *(undefined8 *)((long)entries._M_elems[4].super_handle.m_ptr + 0x18 + lVar2) = uVar1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x28);
  entries._M_elems[4].super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(entries._M_elems + 4);
LAB_002be47b:
  lVar2 = 0x20;
  do {
    object::~object((object *)((long)(entries._M_elems + -1) + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        PYBIND11_WORKAROUND_INCORRECT_MSVC_C4100(src, policy, parent);
        PYBIND11_WORKAROUND_INCORRECT_GCC_UNUSED_BUT_SET_PARAMETER(policy, parent);
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }